

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_bind.h
# Opt level: O0

class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
 pybind11::
 bind_vector<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>
           (handle scope,string *name)

{
  handle scope_00;
  type_info *f;
  constructor<> *init;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
  *in_RSI;
  handle in_RDI;
  offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr *unaff_retaddr;
  class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
  *in_stack_00000008;
  undefined7 in_stack_00000010;
  bool in_stack_00000017;
  type_index *in_stack_00000018;
  enable_if_t<is_copy_constructible<typename_vector<ReadPath>::value_type>::value,_pybind11::class_<std::vector<ReadPath>,_std::unique_ptr<std::vector<ReadPath>_>_>_>
  *in_stack_00000050;
  bool local;
  type_info *vtype_info;
  Class_ *cl;
  class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
  *cl_00;
  byte local_61;
  class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
  local_39;
  undefined1 local_2a;
  byte local_29;
  type_index in_stack_ffffffffffffffd8;
  handle extra;
  
  extra.m_ptr = in_RDI.m_ptr;
  std::type_index::type_index
            ((type_index *)&stack0xffffffffffffffd8,(type_info *)&ReadPath::typeinfo);
  f = detail::get_type_info(in_stack_00000018,in_stack_00000017);
  local_61 = 1;
  if (f != (type_info *)0x0) {
    local_61 = (byte)f->field_0x90 >> 3 & 1;
  }
  local_29 = local_61;
  local_2a = 0;
  init = (constructor<> *)std::__cxx11::string::c_str();
  cl_00 = &local_39;
  module_local::module_local((module_local *)cl_00,(bool)(local_29 & 1));
  scope_00.m_ptr._7_1_ = in_stack_00000017;
  scope_00.m_ptr._0_7_ = in_stack_00000010;
  class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
  ::class_<pybind11::module_local>
            (in_stack_00000008,scope_00,(char *)unaff_retaddr,(module_local *)extra.m_ptr);
  detail::
  vector_buffer<std::vector<ReadPath,std::allocator<ReadPath>>,pybind11::class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>>
            (cl_00);
  init<>();
  class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
  ::def<>(cl_00,init);
  detail::
  vector_if_copy_constructible<std::vector<ReadPath,std::allocator<ReadPath>>,pybind11::class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>>
            (cl_00);
  detail::
  vector_if_equal_operator<std::vector<ReadPath,std::allocator<ReadPath>>,pybind11::class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>,pybind11::class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>>
            ((class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
              *)in_RDI.m_ptr);
  detail::
  vector_if_insertion_operator<std::vector<ReadPath,std::allocator<ReadPath>>,pybind11::class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>,pybind11::class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>,std::__cxx11::string>
            ((class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
              *)in_RDI.m_ptr,in_RDX);
  detail::
  vector_modifiers<std::vector<ReadPath,std::allocator<ReadPath>>,pybind11::class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>>
            (in_stack_00000050);
  detail::
  vector_accessor<std::vector<ReadPath,std::allocator<ReadPath>>,pybind11::class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>>
            (cl_00);
  class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>
  ::
  def<pybind11::bind_vector<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>(pybind11::handle,std::__cxx11::string_const&)::_lambda(std::vector<ReadPath,std::allocator<ReadPath>>const&)_1_,char[35]>
            (in_RSI,(char *)in_RDX,(type *)f,(char (*) [35])in_stack_ffffffffffffffd8._M_target);
  class_<std::vector<ReadPath,std::allocator<ReadPath>>,std::unique_ptr<std::vector<ReadPath,std::allocator<ReadPath>>,std::default_delete<std::vector<ReadPath,std::allocator<ReadPath>>>>>
  ::def<unsigned_long(std::vector<ReadPath,std::allocator<ReadPath>>::*)()const>
            ((class_<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::unique_ptr<std::vector<ReadPath,_std::allocator<ReadPath>_>,_std::default_delete<std::vector<ReadPath,_std::allocator<ReadPath>_>_>_>_>
              *)CONCAT17(in_stack_00000017,in_stack_00000010),(char *)in_stack_00000008,
             unaff_retaddr);
  return (generic_type)(generic_type)in_RDI.m_ptr;
}

Assistant:

class_<Vector, holder_type> bind_vector(handle scope, std::string const &name, Args&&... args) {
    using Class_ = class_<Vector, holder_type>;

    // If the value_type is unregistered (e.g. a converting type) or is itself registered
    // module-local then make the vector binding module-local as well:
    using vtype = typename Vector::value_type;
    auto vtype_info = detail::get_type_info(typeid(vtype));
    bool local = !vtype_info || vtype_info->module_local;

    Class_ cl(scope, name.c_str(), pybind11::module_local(local), std::forward<Args>(args)...);

    // Declare the buffer interface if a buffer_protocol() is passed in
    detail::vector_buffer<Vector, Class_, Args...>(cl);

    cl.def(init<>());

    // Register copy constructor (if possible)
    detail::vector_if_copy_constructible<Vector, Class_>(cl);

    // Register comparison-related operators and functions (if possible)
    detail::vector_if_equal_operator<Vector, Class_>(cl);

    // Register stream insertion operator (if possible)
    detail::vector_if_insertion_operator<Vector, Class_>(cl, name);

    // Modifiers require copyable vector value type
    detail::vector_modifiers<Vector, Class_>(cl);

    // Accessor and iterator; return by value if copyable, otherwise we return by ref + keep-alive
    detail::vector_accessor<Vector, Class_>(cl);

    cl.def("__bool__",
        [](const Vector &v) -> bool {
            return !v.empty();
        },
        "Check whether the list is nonempty"
    );

    cl.def("__len__", &Vector::size);




#if 0
    // C++ style functions deprecated, leaving it here as an example
    cl.def(init<size_type>());

    cl.def("resize",
         (void (Vector::*) (size_type count)) & Vector::resize,
         "changes the number of elements stored");

    cl.def("erase",
        [](Vector &v, SizeType i) {
        if (i >= v.size())
            throw index_error();
        v.erase(v.begin() + i);
    }, "erases element at index ``i``");

    cl.def("empty",         &Vector::empty,         "checks whether the container is empty");
    cl.def("size",          &Vector::size,          "returns the number of elements");
    cl.def("push_back", (void (Vector::*)(const T&)) &Vector::push_back, "adds an element to the end");
    cl.def("pop_back",                               &Vector::pop_back, "removes the last element");

    cl.def("max_size",      &Vector::max_size,      "returns the maximum possible number of elements");
    cl.def("reserve",       &Vector::reserve,       "reserves storage");
    cl.def("capacity",      &Vector::capacity,      "returns the number of elements that can be held in currently allocated storage");
    cl.def("shrink_to_fit", &Vector::shrink_to_fit, "reduces memory usage by freeing unused memory");

    cl.def("clear", &Vector::clear, "clears the contents");
    cl.def("swap",   &Vector::swap, "swaps the contents");

    cl.def("front", [](Vector &v) {
        if (v.size()) return v.front();
        else throw index_error();
    }, "access the first element");

    cl.def("back", [](Vector &v) {
        if (v.size()) return v.back();
        else throw index_error();
    }, "access the last element ");

#endif

    return cl;
}